

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderInput.cpp
# Opt level: O3

void __thiscall
glcts::GeometryShader_gl_in_ArrayLengthTest::initCaseProgram
          (GeometryShader_gl_in_ArrayLengthTest *this,Case *info,GLchar **captured_varyings,
          GLuint n_captured_varyings_size)

{
  bool bVar1;
  int iVar2;
  GLint GVar3;
  deUint32 err;
  undefined4 extraout_var;
  TestError *this_00;
  char *local_58;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  char *local_40;
  long lVar4;
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  GVar3 = (**(code **)(lVar4 + 0x3c8))();
  info->po_id = GVar3;
  GVar3 = (**(code **)(lVar4 + 0x3f0))(0x8b31);
  info->vs_id = GVar3;
  GVar3 = (**(code **)(lVar4 + 0x3f0))((this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER);
  info->gs_id = GVar3;
  GVar3 = (**(code **)(lVar4 + 0x3f0))(0x8b30);
  info->fs_id = GVar3;
  err = (**(code **)(lVar4 + 0x800))();
  glu::checkError(err,"Could not create program object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
                  ,0x346);
  local_58 = "${VERSION}\n\n${GEOMETRY_SHADER_REQUIRE}\n\n";
  local_50 = *(undefined4 *)&info->input_body_part;
  uStack_4c = *(undefined4 *)((long)&info->input_body_part + 4);
  uStack_48 = *(undefined4 *)&info->output_body_part;
  uStack_44 = *(undefined4 *)((long)&info->output_body_part + 4);
  local_40 = 
  "\nflat out int in_array_size;\n\nvoid main()\n{\n    for (int n = 0; n < N_OUT_VERTICES; n++)\n    {\n        in_array_size = gl_in.length();\n        EmitVertex();\n    }\n\n    EndPrimitive();\n}\n"
  ;
  (**(code **)(lVar4 + 0x14c8))(info->po_id,n_captured_varyings_size,captured_varyings,0x8c8d);
  bVar1 = TestCaseBase::buildProgram
                    (&this->super_TestCaseBase,info->po_id,info->fs_id,1,&m_fragment_shader_code,
                     info->gs_id,4,&local_58,info->vs_id,1,&m_vertex_shader_code,(bool *)0x0);
  if (bVar1) {
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Could not create program from valid vertex/geometry/fragment shader",
             (char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
             ,0x355);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void GeometryShader_gl_in_ArrayLengthTest::initCaseProgram(Case& info, const glw::GLchar** captured_varyings,
														   glw::GLuint n_captured_varyings_size)
{
	/* GL */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create program and shader objects */
	info.po_id = gl.createProgram();

	info.vs_id = gl.createShader(GL_VERTEX_SHADER);
	info.gs_id = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
	info.fs_id = gl.createShader(GL_FRAGMENT_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create program object");

	/* Prepare geometry shader parts */
	const char* const geometry_shader_parts[] = { m_geometry_shader_code_preamble, info.input_body_part,
												  info.output_body_part, m_geometry_shader_code_main };

	/* Set up transform feedback */
	gl.transformFeedbackVaryings(info.po_id, n_captured_varyings_size, captured_varyings, GL_SEPARATE_ATTRIBS);

	/* Build program */
	if (false == buildProgram(info.po_id, info.fs_id, 1 /* number of fragment shader code parts */,
							  &m_fragment_shader_code, info.gs_id, DE_LENGTH_OF_ARRAY(geometry_shader_parts),
							  geometry_shader_parts, info.vs_id, 1 /* number of vertex shader code parts */,
							  &m_vertex_shader_code))
	{
		TCU_FAIL("Could not create program from valid vertex/geometry/fragment shader");
	}
}